

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O1

string * __thiscall
VulkanUtilities::PrintExtensionsList_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,
          vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
          size_t NumColumns)

{
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *pvVar1;
  char *pcVar2;
  void *pvVar3;
  _Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *p_Var4;
  string *psVar5;
  size_t sVar6;
  ostream *poVar7;
  undefined1 *puVar8;
  ulong uVar9;
  long lVar10;
  undefined1 *puVar11;
  size_type *psVar12;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *pvVar13;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ColWidth;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ExtStrings;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long lStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  if (Extensions == (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0) {
    Diligent::FormatString<char[26],char[15]>
              ((string *)local_1b8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumColumns > 0",(char (*) [15])NumColumns);
    Diligent::DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"PrintExtensionsList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x3c);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_1d8,(*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1);
  pcVar14 = *(char **)this;
  pcVar2 = *(char **)(this + 8);
  if (pcVar14 != pcVar2) {
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)local_1b8 + 0x10 +
                        (int)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18));
      }
      else {
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),pcVar14,sVar6);
      }
      local_1f8._M_dataplus._M_p._0_1_ = 0x20;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(char *)&local_1f8,1);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_1f8._M_dataplus._M_p._0_1_ = 0x2e;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1f8,1);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_1f8._M_dataplus._M_p._0_1_ = 0x2e;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1f8,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          &local_1f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                        local_1f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      pcVar14 = pcVar14 + 0x104;
    } while (pcVar14 != pcVar2);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,
             (size_type)Extensions,(allocator_type *)local_1b8);
  if (*(long *)(this + 8) - *(long *)this != 0) {
    puVar8 = (undefined1 *)((*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1);
    puVar11 = (undefined1 *)0x0;
    do {
      if (Extensions != (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0
         ) {
        psVar12 = &local_1d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)puVar11]._M_string_length;
        pvVar13 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1;
        do {
          uVar15 = *(ulong *)(CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_) + -8 + (long)pvVar13 * 8);
          uVar9 = *psVar12;
          if (*psVar12 < uVar15) {
            uVar9 = uVar15;
          }
          *(ulong *)(CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) +
                     -8 + (long)pvVar13 * 8) = uVar9;
          pvVar1 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                   ((long)&(pvVar13->
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
        } while ((pvVar13 < Extensions) &&
                (p_Var4 = &pvVar13->
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                , psVar12 = psVar12 + 4, pvVar13 = pvVar1, puVar11 + (long)p_Var4 < puVar8));
        puVar11 = (undefined1 *)
                  ((long)&((_Vector_impl_data *)(puVar11 + -1))->_M_start +
                  (long)&pvVar1->
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                  );
      }
    } while (puVar11 < puVar8);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  if (*(long *)(this + 8) != *(long *)this) {
    uVar15 = 0;
    do {
      uVar9 = uVar15;
      if (Extensions != (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0
         ) {
        lVar10 = uVar15 << 5;
        pvVar13 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1;
        do {
          uVar9 = (long)pvVar13 + (uVar15 - 1);
          if ((ulong)((*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1) <= uVar9)
          goto LAB_00269ece;
          pcVar14 = "    ";
          if (pvVar13 ==
              (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1) {
            pcVar14 = "\n    ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),pcVar14,
                     (ulong)(pvVar13 ==
                            (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *
                            )0x1) | 4);
          if ((pvVar13 < Extensions) &&
             ((long)&(pvVar13->
                     super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar15 <
              (ulong)((*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1))) {
            *(long *)((long)&lStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
                 (long)*(int *)(CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                         local_1f8._M_dataplus._M_p._0_1_) + -8 + (long)pvVar13 * 8)
            ;
            *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
                 0xffffff4f | 0x20;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),
                     *(char **)((long)&((local_1d8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar10),
                     *(long *)((long)&(local_1d8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + lVar10));
          p_Var4 = &pvVar13->
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
          ;
          lVar10 = lVar10 + 0x20;
          bVar16 = pvVar13 != Extensions;
          pvVar13 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                    ((long)&(p_Var4->_M_impl).super__Vector_impl_data._M_start + 1);
        } while (bVar16);
        uVar9 = (long)&(p_Var4->_M_impl).super__Vector_impl_data._M_start + uVar15;
      }
LAB_00269ece:
      uVar15 = uVar9;
    } while (uVar9 < (ulong)((*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1));
  }
  psVar5 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  pvVar3 = (void *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1f8.field_2._M_allocated_capacity - (long)pvVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return psVar5;
}

Assistant:

std::string PrintExtensionsList(const std::vector<VkExtensionProperties>& Extensions, size_t NumColumns)
{
    VERIFY_EXPR(NumColumns > 0);

    std::vector<std::string> ExtStrings;
    ExtStrings.reserve(Extensions.size());
    for (const auto& Ext : Extensions)
    {
        std::stringstream ss;
        ss << Ext.extensionName << ' '
           << VK_API_VERSION_MAJOR(Ext.specVersion) << '.'
           << VK_API_VERSION_MINOR(Ext.specVersion) << '.'
           << VK_API_VERSION_PATCH(Ext.specVersion);
        ExtStrings.emplace_back(ss.str());
    }

    std::vector<size_t> ColWidth(NumColumns);
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ColWidth[col] = std::max(ColWidth[col], ExtStrings[i].length());
        }
    }

    std::stringstream ss;
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ss << (col == 0 ? "\n    " : "    ");
            if (col + 1 < NumColumns && i + 1 < Extensions.size())
                ss << std::setw(static_cast<int>(ColWidth[col])) << std::left;
            ss << ExtStrings[i];
        }
    }

    return ss.str();
}